

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<3l>::search<anurbs::RTree<3l>::PickByBox>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,void *this,PickByBox *check,
          Callback *callback)

{
  double *pdVar1;
  double dVar2;
  iterator __position;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  runtime_error *this_00;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  vector<long,_std::allocator<long>_> queue;
  Index index;
  vector<long,_std::allocator<long>_> local_a8;
  vector<long,std::allocator<long>> *local_88;
  long local_80;
  long local_78;
  _Any_data *local_70;
  double local_68;
  double adStack_60 [4];
  double adStack_40 [2];
  
  lVar10 = *(long *)((long)this + 0x68) - *(long *)((long)this + 0x60) >> 3;
  local_70 = (_Any_data *)callback;
  if (*(long *)((long)this + 0x58) != lVar10) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Data not yet indexed - call RTree::finish().");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar8 = *(long *)((long)this + 0x10);
  lVar9 = *(long *)((long)this + 0x18);
  local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (long *)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = (vector<long,std::allocator<long>> *)__return_storage_ptr__;
  if (0 < lVar10) {
    lVar10 = lVar10 + -1;
    lVar8 = (lVar9 - lVar8 >> 3) + -1;
    do {
      lVar7 = *(long *)((long)this + 8) + lVar10;
      lVar9 = *(long *)(*(long *)((long)this + 0x10) + lVar8 * 8);
      if (lVar9 < lVar7) {
        lVar7 = lVar9;
      }
      if (lVar10 < lVar7) {
        lVar8 = lVar8 + -1;
        lVar9 = lVar10;
        do {
          local_80 = *(long *)(*(long *)((long)this + 0x60) + lVar9 * 8);
          lVar3 = lVar9 * 0x18;
          adStack_40[1] = (double)*(undefined8 *)(*(long *)((long)this + 0x78) + 0x10 + lVar3);
          pdVar1 = (double *)(*(long *)((long)this + 0x78) + lVar3);
          adStack_60[3] = *pdVar1;
          adStack_40[0] = pdVar1[1];
          adStack_60[1] = (double)*(undefined8 *)(*(long *)((long)this + 0x90) + 0x10 + lVar3);
          pdVar1 = (double *)(*(long *)((long)this + 0x90) + lVar3);
          local_68 = *pdVar1;
          adStack_60[0] = pdVar1[1];
          if (adStack_60[3] <
              (check->m_box_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[0] ||
              adStack_60[3] ==
              (check->m_box_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[0]) {
            if ((check->m_box_min).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                m_storage.m_data.array[0] <= local_68) {
              uVar4 = 0;
              do {
                uVar6 = uVar4;
                if (uVar6 == 2) break;
                pdVar1 = (check->m_box_max).
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                         m_data.array + uVar6 + 1;
                if (*pdVar1 <= adStack_40[uVar6] && adStack_40[uVar6] != *pdVar1) break;
                dVar2 = (check->m_box_min).
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                        m_data.array[uVar6 + 1];
                uVar4 = uVar6 + 1;
              } while (dVar2 < adStack_60[uVar6] || dVar2 == adStack_60[uVar6]);
              if (1 < uVar6) {
                if (lVar10 < *this) {
                  if (*(long *)(local_70 + 1) != 0) {
                    local_78 = local_80;
                    bVar5 = (**(code **)(local_70->_M_pod_data + 0x18))(local_70,&local_78);
                    if (!bVar5) goto LAB_001dd716;
                  }
                  __position._M_current = *(long **)(local_88 + 8);
                  if (__position._M_current == *(long **)(local_88 + 0x10)) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              (local_88,__position,&local_80);
                  }
                  else {
                    *__position._M_current = local_80;
                    *(long **)(local_88 + 8) = __position._M_current + 1;
                  }
                }
                else {
                  if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              ((vector<long,std::allocator<long>> *)&local_a8,
                               (iterator)
                               local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_80);
                  }
                  else {
                    *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_80;
                    local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  local_78 = lVar8;
                  if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                              (&local_a8,
                               (iterator)
                               local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_78);
                  }
                  else {
                    *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish = lVar8;
                    local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
              }
            }
          }
LAB_001dd716:
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar7);
      }
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        lVar10 = -1;
        lVar8 = -1;
      }
      else {
        lVar8 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        lVar10 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish[-2];
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + -2;
      }
    } while (-1 < lVar10);
  }
  if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (vector<long,_std::allocator<long>_> *)local_88;
}

Assistant:

std::vector<Index> search(const TCheck& check, Callback callback)
    {
        if (m_position != length(m_indices)) {
            throw std::runtime_error("Data not yet indexed - call RTree::finish().");
        }

        Index node_index = length(m_indices) - 1;
        Index level = length(m_level_bounds) - 1;
        std::vector<Index> queue;
        std::vector<Index> results;

        while (node_index > -1) {
            const Index end = std::min<Index>(node_index + m_node_size, m_level_bounds[level]);

            for (Index pos = node_index; pos < end; pos++) {
                const Index index = m_indices[pos];

                const Vector node_min = m_boxes_min[pos];
                const Vector node_max = m_boxes_max[pos];

                if (!check(node_min, node_max)) {
                    continue;
                }

                if (node_index < m_nb_items) {
                    if (callback == nullptr || callback(index)) {
                        results.push_back(index);
                    }
                } else {
                    queue.push_back(index);
                    queue.push_back(level - 1);
                }
            }

            if (queue.empty()) {
                node_index = -1;
                level = -1;
            } else {
                level = queue.back();
                queue.pop_back();
                node_index = queue.back();
                queue.pop_back();
            }
        }

        return results;
    }